

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::getSentenceVector(FastText *this,istream *in,Vector *svec)

{
  bool bVar1;
  element_type *peVar2;
  ulong uVar3;
  size_type sVar4;
  istream *piVar5;
  FastText *in_RDX;
  istream *in_RSI;
  real rVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  real norm;
  int32_t count;
  string word;
  istringstream iss;
  string sentence;
  Vector vec;
  int32_t i;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  Vector *in_stack_fffffffffffffd90;
  string *this_00;
  Vector *in_stack_fffffffffffffd98;
  FastText *in_stack_fffffffffffffda0;
  int64_t in_stack_fffffffffffffda8;
  Vector *in_stack_fffffffffffffdb0;
  int local_234;
  string *in_stack_fffffffffffffdd0;
  Vector *in_stack_fffffffffffffdd8;
  FastText *in_stack_fffffffffffffde0;
  istringstream local_210 [8];
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdf8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe00;
  istream *in_stack_fffffffffffffe08;
  Dictionary *in_stack_fffffffffffffe10;
  string local_90 [56];
  int local_58;
  vector<int,_std::allocator<int>_> local_30;
  undefined8 local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  Vector::zero(in_stack_fffffffffffffd90);
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x176c23);
  if (peVar2->model == sup) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x176c42);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x176c54);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x176c62);
    Dictionary::getLine(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    local_58 = 0;
    while( true ) {
      uVar3 = (ulong)local_58;
      sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_30);
      auVar7 = in_ZMM0._0_16_;
      if (sVar4 <= uVar3) break;
      in_stack_fffffffffffffda0 = local_18;
      std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_58);
      addInputVector(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                     (int32_t)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      local_58 = local_58 + 1;
    }
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd90);
    if (!bVar1) {
      sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_30);
      vcvtusi2sd_avx512f(auVar7,sVar4);
      Vector::mul((Vector *)in_stack_fffffffffffffda0,local_18._4_4_);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd90);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd90);
  }
  else {
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x176da5);
    Vector::Vector(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    this_00 = local_90;
    std::__cxx11::string::string(this_00);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,this_00);
    std::__cxx11::istringstream::istringstream(local_210,local_90,_S_in);
    std::__cxx11::string::string((string *)&stack0xfffffffffffffdd0);
    local_234 = 0;
    while( true ) {
      piVar5 = std::operator>>((istream *)local_210,(string *)&stack0xfffffffffffffdd0);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar1) break;
      getWordVector(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      rVar6 = Vector::norm((Vector *)in_stack_fffffffffffffda0);
      if (0.0 < rVar6) {
        Vector::mul((Vector *)in_stack_fffffffffffffda0,
                    (real)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        Vector::addVector((Vector *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        local_234 = local_234 + 1;
      }
    }
    if (0 < local_234) {
      Vector::mul((Vector *)in_stack_fffffffffffffda0,
                  (real)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    }
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
    std::__cxx11::istringstream::~istringstream(local_210);
    std::__cxx11::string::~string(local_90);
    Vector::~Vector((Vector *)0x176f83);
  }
  return;
}

Assistant:

void FastText::getSentenceVector(std::istream& in, fasttext::Vector& svec) {
	svec.zero();
	if (args_->model == model_name::sup) {
		std::vector<int32_t> line, labels;
		dict_->getLine(in, line, labels);
		for (int32_t i = 0; i < line.size(); i++) {
			addInputVector(svec, line[i]);
		}
		if (!line.empty()) {
			svec.mul(1.0 / line.size());
		}
	} else {
		Vector vec(args_->dim);
		std::string sentence;
		std::getline(in, sentence);
		std::istringstream iss(sentence);
		std::string word;
		int32_t count = 0;
		while (iss >> word) {
			getWordVector(vec, word);
			real norm = vec.norm();
			if (norm > 0) {
				vec.mul(1.0 / norm);
				svec.addVector(vec);
				count++;
			}
		}
		if (count > 0) {
			svec.mul(1.0 / count);
		}
	}
}